

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

void __thiscall
cpptrace::stacktrace::print
          (stacktrace *this,ostream *stream,bool color,bool newline_at_end,char *header)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  size_type sVar4;
  reference frame_00;
  const_reference pvVar5;
  char *local_70;
  stacktrace_frame *frame;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *__range1;
  size_t sStack_30;
  uint frame_number_width;
  size_t counter;
  char *header_local;
  bool newline_at_end_local;
  bool color_local;
  ostream *stream_local;
  stacktrace *this_local;
  
  if ((color) &&
     (((stream == (ostream *)&std::cout && (uVar2 = isatty(stdout_fileno), (uVar2 & 1) != 0)) ||
      ((stream == (ostream *)&std::cerr && (uVar2 = isatty(stderr_fileno), (uVar2 & 1) != 0)))))) {
    cpptrace::detail::enable_virtual_terminal_processing_if_needed();
  }
  local_70 = header;
  if (header == (char *)0x0) {
    local_70 = "Stack trace (most recent call first):";
  }
  poVar3 = std::operator<<(stream,local_70);
  uVar2 = 10;
  std::operator<<(poVar3,'\n');
  sStack_30 = 0;
  bVar1 = std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
          empty(&this->frames);
  if (bVar1) {
    std::operator<<(stream,"<empty trace>\n");
  }
  else {
    sVar4 = std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
            size(&this->frames);
    uVar2 = cpptrace::detail::n_digits((detail *)(ulong)((int)sVar4 - 1),uVar2);
    __end1 = std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
             begin(&this->frames);
    frame = (stacktrace_frame *)
            std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
            end(&this->frames);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
                                       *)&frame), bVar1) {
      frame_00 = __gnu_cxx::
                 __normal_iterator<const_cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
                 ::operator*(&__end1);
      print_frame(stream,color,uVar2,sStack_30,frame_00);
      if ((newline_at_end) ||
         (pvVar5 = std::
                   vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
                   back(&this->frames), frame_00 != pvVar5)) {
        std::operator<<(stream,'\n');
      }
      sStack_30 = sStack_30 + 1;
      __gnu_cxx::
      __normal_iterator<const_cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void stacktrace::print(std::ostream& stream, bool color, bool newline_at_end, const char* header) const {
        if(
            color && (
                (&stream == &std::cout && isatty(stdout_fileno)) || (&stream == &std::cerr && isatty(stderr_fileno))
            )
        ) {
            detail::enable_virtual_terminal_processing_if_needed();
        }
        stream << (header ? header : "Stack trace (most recent call first):") << '\n';
        std::size_t counter = 0;
        if(frames.empty()) {
            stream << "<empty trace>\n";
            return;
        }
        const auto frame_number_width = detail::n_digits(static_cast<int>(frames.size()) - 1);
        for(const auto& frame : frames) {
            print_frame(stream, color, frame_number_width, counter, frame);
            if(newline_at_end || &frame != &frames.back()) {
                stream << '\n';
            }
            counter++;
        }
    }